

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.cpp
# Opt level: O0

void nodecpp::VirtualMemory::deallocate(void *ptr,size_t size)

{
  int obj_2;
  size_t obj_1;
  size_t obj;
  int *piVar1;
  char *obj_3;
  bad_alloc *this;
  ModuleID local_30;
  int local_28;
  int local_24;
  int e;
  int ret;
  size_t local_18;
  size_t size_local;
  void *ptr_local;
  
  _e = &local_18;
  local_18 = size;
  size_local = (size_t)ptr;
  assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,nodecpp::VirtualMemory::deallocate(void*,unsigned_long)::__0>
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/src/page_allocator.cpp"
             ,0x55,(anon_class_8_1_89918cff *)&e,"size % 4096 == 0");
  local_24 = munmap((void *)size_local,local_18);
  if (local_24 == -1) {
    piVar1 = __errno_location();
    local_28 = *piVar1;
    log::ModuleID::ModuleID(&local_30,"foundation");
    obj = size_local;
    obj_1 = local_18;
    obj_2 = local_28;
    obj_3 = strerror(local_28);
    log::default_log::error<char_const*,unsigned_long,unsigned_long,int,char*>
              (&local_30,"munmap error at deallocate(0x{:x}, 0x{:x}), error = {} ({})",obj,obj_1,
               obj_2,obj_3);
    this = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this);
    __cxa_throw(this,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return;
}

Assistant:

void VirtualMemory::deallocate(void* ptr, size_t size)
{
	NODECPP_ASSERT(nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, size % 4096 == 0 );
	int ret = munmap(ptr, size);
 	if ( ret == -1 )
	{
		int e = errno;
		nodecpp::log::default_log::error( nodecpp::log::ModuleID(nodecpp::foundation_module_id), "munmap error at deallocate(0x{:x}, 0x{:x}), error = {} ({})", (size_t)(ptr), size, e, strerror(e) );
//		nodecpp::log::default_log::error( nodecpp::log::ModuleID(nodecpp::foundation_module_id), "munmap error at deallocate({}), error = {} ({})", size, e, strerror(e) );
		throw std::bad_alloc();
	}
}